

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

void __thiscall
booster::callback<void_(cppcms::http::context::completion_type)>::
callable_impl<void,_async_unit_test::binder>::callable_impl
          (callable_impl<void,_async_unit_test::binder> *this,binder *f)

{
  binder *in_RDI;
  binder *in_stack_ffffffffffffffd8;
  
  callable<void_(cppcms::http::context::completion_type)>::callable
            ((callable<void_(cppcms::http::context::completion_type)> *)in_RDI);
  (in_RDI->context).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__callable_impl_00116958;
  async_unit_test::binder::binder(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

callable_impl(F f) : func(f){}